

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall
Imf_3_4::Array2D<Imath_3_2::half>::resizeEraseUnsafe
          (Array2D<Imath_3_2::half> *this,long sizeX,long sizeY)

{
  half *phVar1;
  ulong uVar2;
  
  if (this->_data != (half *)0x0) {
    operator_delete__(this->_data);
  }
  uVar2 = 0xffffffffffffffff;
  if (-1 < sizeY * sizeX) {
    uVar2 = sizeY * sizeX * 2;
  }
  this->_sizeX = 0;
  this->_sizeY = 0;
  this->_data = (half *)0x0;
  phVar1 = (half *)operator_new__(uVar2);
  this->_data = phVar1;
  this->_sizeX = sizeX;
  this->_sizeY = sizeY;
  return;
}

Assistant:

inline void
Array2D<T>::resizeEraseUnsafe (long sizeX, long sizeY)
{
    delete[] _data;
    _data  = 0;
    _sizeX = 0;
    _sizeY = 0;
    _data  = new T[sizeX * sizeY];
    _sizeX = sizeX;
    _sizeY = sizeY;
}